

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O1

bool mahjong::is_knitted_straight_wait
               (tile_t *standing_tiles,intptr_t standing_cnt,useful_table_t *waiting_table)

{
  bool bVar1;
  int i;
  long lVar2;
  undefined1 *puVar3;
  ulong uVar4;
  int iVar5;
  intptr_t left_cnt;
  long lVar6;
  undefined1 *puVar7;
  tile_t missing_tiles [9];
  tile_table_t cnt_table;
  byte local_151 [9];
  uint16_t local_148 [72];
  short local_b8 [76];
  
  if (standing_tiles == (tile_t *)0x0) {
    return false;
  }
  if ((standing_cnt == 0xd) || (standing_cnt == 10)) {
    memset(local_b8,0,0x90);
    if (0 < standing_cnt) {
      lVar2 = 0;
      do {
        local_b8[standing_tiles[lVar2]] = local_b8[standing_tiles[lVar2]] + 1;
        lVar2 = lVar2 + 1;
      } while (standing_cnt != lVar2);
    }
    puVar3 = &standard_knitted_straight;
    puVar7 = (undefined1 *)0x0;
    uVar4 = 0;
    do {
      lVar2 = 0;
      iVar5 = 0;
      do {
        if (local_b8[(byte)puVar3[lVar2]] == 0) {
          lVar6 = (long)iVar5;
          iVar5 = iVar5 + 1;
          local_151[lVar6] = puVar3[lVar2];
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 9);
      if (iVar5 < 2) {
        puVar7 = &standard_knitted_straight + (uVar4 & 0xffffffff) * 9;
        break;
      }
      uVar4 = uVar4 + 1;
      puVar3 = puVar3 + 9;
    } while (uVar4 != 6);
    if (iVar5 < 3 && puVar7 != (undefined1 *)0x0) {
      if (waiting_table != (useful_table_t *)0x0) {
        *(bool *)((long)waiting_table + 0x30) = false;
        *(bool *)((long)waiting_table + 0x31) = false;
        *(bool *)((long)waiting_table + 0x32) = false;
        *(bool *)((long)waiting_table + 0x33) = false;
        *(bool *)((long)waiting_table + 0x34) = false;
        *(bool *)((long)waiting_table + 0x35) = false;
        *(bool *)((long)waiting_table + 0x36) = false;
        *(bool *)((long)waiting_table + 0x37) = false;
        *(bool *)((long)waiting_table + 0x38) = false;
        *(bool *)((long)waiting_table + 0x39) = false;
        *(bool *)((long)waiting_table + 0x3a) = false;
        *(bool *)((long)waiting_table + 0x3b) = false;
        *(bool *)((long)waiting_table + 0x3c) = false;
        *(bool *)((long)waiting_table + 0x3d) = false;
        *(bool *)((long)waiting_table + 0x3e) = false;
        *(bool *)((long)waiting_table + 0x3f) = false;
        *(bool *)((long)waiting_table + 0x20) = false;
        *(bool *)((long)waiting_table + 0x21) = false;
        *(bool *)((long)waiting_table + 0x22) = false;
        *(bool *)((long)waiting_table + 0x23) = false;
        *(bool *)((long)waiting_table + 0x24) = false;
        *(bool *)((long)waiting_table + 0x25) = false;
        *(bool *)((long)waiting_table + 0x26) = false;
        *(bool *)((long)waiting_table + 0x27) = false;
        *(bool *)((long)waiting_table + 0x28) = false;
        *(bool *)((long)waiting_table + 0x29) = false;
        *(bool *)((long)waiting_table + 0x2a) = false;
        *(bool *)((long)waiting_table + 0x2b) = false;
        *(bool *)((long)waiting_table + 0x2c) = false;
        *(bool *)((long)waiting_table + 0x2d) = false;
        *(bool *)((long)waiting_table + 0x2e) = false;
        *(bool *)((long)waiting_table + 0x2f) = false;
        *(bool *)((long)waiting_table + 0x10) = false;
        *(bool *)((long)waiting_table + 0x11) = false;
        *(bool *)((long)waiting_table + 0x12) = false;
        *(bool *)((long)waiting_table + 0x13) = false;
        *(bool *)((long)waiting_table + 0x14) = false;
        *(bool *)((long)waiting_table + 0x15) = false;
        *(bool *)((long)waiting_table + 0x16) = false;
        *(bool *)((long)waiting_table + 0x17) = false;
        *(bool *)((long)waiting_table + 0x18) = false;
        *(bool *)((long)waiting_table + 0x19) = false;
        *(bool *)((long)waiting_table + 0x1a) = false;
        *(bool *)((long)waiting_table + 0x1b) = false;
        *(bool *)((long)waiting_table + 0x1c) = false;
        *(bool *)((long)waiting_table + 0x1d) = false;
        *(bool *)((long)waiting_table + 0x1e) = false;
        *(bool *)((long)waiting_table + 0x1f) = false;
        *(bool *)((long)waiting_table + 0) = false;
        *(bool *)((long)waiting_table + 1) = false;
        *(bool *)((long)waiting_table + 2) = false;
        *(bool *)((long)waiting_table + 3) = false;
        *(bool *)((long)waiting_table + 4) = false;
        *(bool *)((long)waiting_table + 5) = false;
        *(bool *)((long)waiting_table + 6) = false;
        *(bool *)((long)waiting_table + 7) = false;
        *(bool *)((long)waiting_table + 8) = false;
        *(bool *)((long)waiting_table + 9) = false;
        *(bool *)((long)waiting_table + 10) = false;
        *(bool *)((long)waiting_table + 0xb) = false;
        *(bool *)((long)waiting_table + 0xc) = false;
        *(bool *)((long)waiting_table + 0xd) = false;
        *(bool *)((long)waiting_table + 0xe) = false;
        *(bool *)((long)waiting_table + 0xf) = false;
        *(bool *)((long)waiting_table + 0x40) = false;
        *(bool *)((long)waiting_table + 0x41) = false;
        *(bool *)((long)waiting_table + 0x42) = false;
        *(bool *)((long)waiting_table + 0x43) = false;
        *(bool *)((long)waiting_table + 0x44) = false;
        *(bool *)((long)waiting_table + 0x45) = false;
        *(bool *)((long)waiting_table + 0x46) = false;
        *(bool *)((long)waiting_table + 0x47) = false;
      }
      memcpy(local_148,local_b8,0x90);
      lVar2 = 0;
      do {
        if (local_148[(byte)puVar7[lVar2]] != 0) {
          local_148[(byte)puVar7[lVar2]] = local_148[(byte)puVar7[lVar2]] - 1;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 9);
      if (iVar5 == 0) {
        if (standing_cnt == 10) {
          bVar1 = is_basic_form_wait_1(&local_148,waiting_table);
          return bVar1;
        }
        bVar1 = is_basic_form_wait_recursively(&local_148,4,waiting_table);
        return bVar1;
      }
      if (iVar5 == 1) {
        if (standing_cnt == 10) {
          left_cnt = 2;
        }
        else {
          left_cnt = 5;
        }
        bVar1 = is_basic_form_win_recursively(&local_148,left_cnt);
        if (!bVar1 || waiting_table == (useful_table_t *)0x0) {
          return bVar1;
        }
        (*waiting_table)[local_151[0]] = true;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_knitted_straight_wait(const tile_t *standing_tiles, intptr_t standing_cnt, useful_table_t *waiting_table) {
    if (standing_tiles == nullptr || (standing_cnt != 13 && standing_cnt != 10)) {
        return false;
    }

    // 对立牌的种类进行打表
    tile_table_t cnt_table;
    map_tiles(standing_tiles, standing_cnt, &cnt_table);

    return is_knitted_straight_wait_from_table(cnt_table, standing_cnt, waiting_table);
}